

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::convertToXYZFloat
               (float *out,float *whitepoint,float *in,uint w,uint h,LodePNGState *state)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  LodePNGICCCurve *curve;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  float fVar7;
  LodePNGICC icc;
  LodePNGICC local_158;
  
  local_158.trc[0].lut = (float *)0x0;
  local_158.trc[0].lut_size = 0;
  local_158.trc[1].lut = (float *)0x0;
  local_158.trc[1].lut_size = 0;
  local_158.trc[2].lut = (float *)0x0;
  local_158.trc[2].lut_size = 0;
  uVar1 = 0;
  if ((state->info_png).iccp_defined != 0) {
    uVar1 = parseICC(&local_158,(state->info_png).iccp_profile,
                     (ulong)(state->info_png).iccp_profile_size);
    uVar3 = 1;
    if (uVar1 != 0) goto LAB_0011cce3;
    if (local_158.inputspace == 0) {
      uVar1 = 0;
    }
    else if (((local_158.inputspace != 2) || (uVar1 = 0, local_158.has_chromaticity != 0)) &&
            (uVar1 = 0, local_158.has_whitepoint != 0)) {
      uVar1 = (uint)(local_158.has_trc != 0);
    }
  }
  uVar4 = (ulong)(h * w);
  if (h * w == 0) {
    if (uVar1 == 0) goto LAB_0011cc2f;
  }
  else {
    lVar2 = 0;
    do {
      out[lVar2] = in[lVar2];
      lVar2 = lVar2 + 1;
    } while (uVar4 * 4 - lVar2 != 0);
    if (uVar1 == 0) {
LAB_0011cc2f:
      if (((state->info_png).gama_defined == 0) || ((state->info_png).srgb_defined != 0)) {
        if (uVar4 != 0) {
          uVar5 = 0;
          pfVar6 = out;
          do {
            lVar2 = 0;
            do {
              fVar7 = in[lVar2];
              if (0.04045 <= fVar7) {
                fVar7 = lodepng_powf((fVar7 + 0.055) / 1.055,2.4);
              }
              else {
                fVar7 = fVar7 / 12.92;
              }
              pfVar6[lVar2] = fVar7;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 3);
            uVar5 = uVar5 + 1;
            pfVar6 = pfVar6 + 4;
            in = in + 4;
          } while (uVar5 != uVar4);
        }
      }
      else {
        uVar3 = (state->info_png).gama_gamma;
        if ((uVar3 != 100000) && (uVar4 != 0)) {
          uVar5 = 0;
          pfVar6 = out;
          do {
            lVar2 = 0;
            do {
              fVar7 = in[lVar2];
              if (0.0 < fVar7) {
                fVar7 = lodepng_powf(fVar7,100000.0 / (float)uVar3);
              }
              pfVar6[lVar2] = fVar7;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 3);
            uVar5 = uVar5 + 1;
            pfVar6 = pfVar6 + 4;
            in = in + 4;
          } while (uVar5 != uVar4);
        }
      }
    }
    else {
      uVar5 = 0;
      pfVar6 = out;
      do {
        curve = local_158.trc;
        lVar2 = 0;
        do {
          fVar7 = iccForwardTRC(curve,in[lVar2]);
          pfVar6[lVar2] = fVar7;
          lVar2 = lVar2 + 1;
          curve = curve + 1;
        } while (lVar2 != 3);
        uVar5 = uVar5 + 1;
        pfVar6 = pfVar6 + 4;
        in = in + 4;
      } while (uVar5 != uVar4);
    }
  }
  convertToXYZ_chrm(out,w,h,&state->info_png,uVar1,&local_158,whitepoint);
  uVar3 = 0;
LAB_0011cce3:
  free(local_158.trc[0].lut);
  free(local_158.trc[1].lut);
  free(local_158.trc[2].lut);
  return uVar3;
}

Assistant:

unsigned convertToXYZFloat(float* out, float whitepoint[3], const float* in,
                           unsigned w, unsigned h, const LodePNGState* state) {
  unsigned error = 0;
  const LodePNGInfo* info = &state->info_png;

  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }
  /* Input is floating point, so lookup table cannot be used, but it's ensured to
  use float pow, not the slower double pow. */
  convertToXYZ_gamma(out, in, w, h, info, use_icc, &icc);
  convertToXYZ_chrm(out, w, h, info, use_icc, &icc, whitepoint);

cleanup:
  lodepng_icc_cleanup(&icc);
  return error;
}